

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_handshake(ptls_t *tls,ptls_buffer_t *_sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long *in_RCX;
  ptls_t *in_RDX;
  long *in_RDI;
  size_t consumed;
  ptls_buffer_t decryptbuf;
  uint8_t *src_end;
  uint8_t *src;
  size_t sendbuf_orig_off;
  int ret;
  st_ptls_record_message_emitter_t emitter;
  ptls_iovec_t *in_stack_00000638;
  ptls_handshake_properties_t *in_stack_00000640;
  ptls_message_emitter_t *in_stack_00000648;
  ptls_t *in_stack_00000650;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  ptls_buffer_t *in_stack_ffffffffffffff40;
  ptls_handshake_properties_t *in_stack_ffffffffffffff60;
  st_ptls_record_message_emitter_t *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  uint8_t in_stack_ffffffffffffff76;
  uint8_t in_stack_ffffffffffffff77;
  ptls_buffer_t *in_stack_ffffffffffffff78;
  ptls_t *tls_00;
  uint local_64;
  long *local_60;
  uint local_4;
  
  if (0xd < *(uint *)(in_RDI + 1)) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x12e1,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  init_record_message_emitter
            ((ptls_t *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
             in_stack_ffffffffffffff68,(ptls_buffer_t *)in_stack_ffffffffffffff60);
  lVar1 = local_60[2];
  if ((int)in_RDI[1] == 0) {
    if ((in_RDX != (ptls_t *)0x0) && (*in_RCX != 0)) {
      __assert_fail("input == NULL || *inlen == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x12e9,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    if (**(long **)(*in_RDI + 0x10) == 0) {
      __assert_fail("tls->ctx->key_exchanges[0] != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x12ea,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    local_4 = send_client_hello(in_stack_00000650,in_stack_00000648,in_stack_00000640,
                                in_stack_00000638);
  }
  else {
    tls_00 = (ptls_t *)((long)(&(in_RDX->traffic_protection).dec + -1) + *in_RCX);
    ptls_buffer_init(in_stack_ffffffffffffff40,
                     (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0x10bdfe)
    ;
    local_64 = 0x202;
    while (local_64 == 0x202 && in_RDX != tls_00) {
      lVar3 = (long)tls_00 - (long)in_RDX;
      local_64 = handle_input(in_RDX,(ptls_message_emitter_t *)tls_00,in_stack_ffffffffffffff78,
                              (void *)CONCAT17(in_stack_ffffffffffffff77,
                                               CONCAT16(in_stack_ffffffffffffff76,
                                                        in_stack_ffffffffffffff70)),
                              (size_t *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      in_RDX = (ptls_t *)(lVar3 + (long)in_RDX);
      if (CONCAT17(in_stack_ffffffffffffff77,
                   CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)) != 0) {
        __assert_fail("decryptbuf.off == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0x12fc,
                      "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                     );
      }
    }
    ptls_buffer_dispose((ptls_buffer_t *)in_stack_ffffffffffffff60);
    if (((local_64 != 0) && (local_64 != 0x202)) && (local_64 != 0x206)) {
      (*ptls_clear_memory)((void *)(*local_60 + lVar1),local_60[2] - lVar1);
      local_60[2] = lVar1;
      if (((local_64 & 0xffffff00) != 0x100) &&
         (iVar2 = ptls_send_alert(tls_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff77,
                                  in_stack_ffffffffffffff76), iVar2 != 0)) {
        local_60[2] = lVar1;
      }
    }
    *in_RCX = *in_RCX - ((long)tls_00 - (long)in_RDX);
    local_4 = local_64;
  }
  return local_4;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *_sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_message_emitter_t emitter;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    init_record_message_emitter(tls, &emitter, _sendbuf);
    size_t sendbuf_orig_off = emitter.super.buf->off;

    /* special handlings */
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START: {
        assert(input == NULL || *inlen == 0);
        assert(tls->ctx->key_exchanges[0] != NULL);
        return send_client_hello(tls, &emitter.super, properties, NULL);
    }
    default:
        break;
    }

    const uint8_t *src = input, *const src_end = src + *inlen;
    ptls_buffer_t decryptbuf;

    ptls_buffer_init(&decryptbuf, "", 0);

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (ret == PTLS_ERROR_IN_PROGRESS && src != src_end) {
        size_t consumed = src_end - src;
        ret = handle_input(tls, &emitter.super, &decryptbuf, src, &consumed, properties);
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    switch (ret) {
    case 0:
    case PTLS_ERROR_IN_PROGRESS:
    case PTLS_ERROR_STATELESS_RETRY:
        break;
    default:
        /* flush partially written response */
        ptls_clear_memory(emitter.super.buf->base + sendbuf_orig_off, emitter.super.buf->off - sendbuf_orig_off);
        emitter.super.buf->off = sendbuf_orig_off;
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (ptls_send_alert(tls, emitter.super.buf, PTLS_ALERT_LEVEL_FATAL,
                                PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                emitter.super.buf->off = sendbuf_orig_off;
        break;
    }

    *inlen -= src_end - src;
    return ret;
}